

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

bool __thiscall cmTargetInternals::IsImported(cmTargetInternals *this)

{
  if (this->TargetVisibility < 4) {
    return (0xcU >> (this->TargetVisibility & 0xf) & 1) != 0;
  }
  __assert_fail("false && \"unknown visibility (IsImported)\"",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmTarget.cxx"
                ,0xb5c,"bool cmTargetInternals::IsImported() const");
}

Assistant:

bool cmTargetInternals::IsImported() const
{
  switch (this->TargetVisibility) {
    case cmTarget::Visibility::Imported:
    case cmTarget::Visibility::ImportedGlobally:
      return true;
    case cmTarget::Visibility::Normal:
    case cmTarget::Visibility::Generated:
      return false;
  }
  assert(false && "unknown visibility (IsImported)");
  return false;
}